

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O2

void * operator_new(size_t size,nothrow_t *param_2)

{
  byte bVar1;
  ThreadCache *this;
  bool bVar2;
  int iVar3;
  void *in_RAX;
  void *pvVar4;
  sbyte sVar5;
  long in_FS_OFFSET;
  void *local_28;
  void *rv;
  
  if ((base::internal::new_hooks_ == 0) &&
     (this = *(ThreadCache **)(in_FS_OFFSET + -8), this != (ThreadCache *)0x0)) {
    if (size < 0x401) {
      sVar5 = 3;
      iVar3 = 7;
    }
    else {
      if (0x40000 < size) goto LAB_0010cce4;
      sVar5 = 7;
      iVar3 = 0x3c7f;
    }
    bVar1 = (&tcmalloc::Static::sizemap_)[(uint)((int)size + iVar3) >> sVar5];
    iVar3 = this->list_[bVar1].size_;
    local_28 = in_RAX;
    bVar2 = tcmalloc::ThreadCache::FreeList::TryPop(this->list_ + bVar1,&local_28);
    if (bVar2) {
      this->size_ = this->size_ - iVar3;
    }
    else {
      local_28 = tcmalloc::ThreadCache::FetchFromCentralCache
                           (this,(uint)bVar1,iVar3,tcmalloc::cpp_nothrow_oom);
    }
    return local_28;
  }
LAB_0010cce4:
  pvVar4 = tcmalloc::allocate_full_cpp_nothrow_oom((tcmalloc *)size,(size_t)param_2);
  return pvVar4;
}

Assistant:

PERFTOOLS_DLL_DECL CACHELINE_ALIGNED_FN
void* tc_new_nothrow(size_t size, const std::nothrow_t&) PERFTOOLS_NOTHROW {
  return malloc_fast_path<tcmalloc::cpp_nothrow_oom>(size);
}